

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbify.cc
# Opt level: O0

void finish(cbify *data)

{
  example *in_RDI;
  vector<example_*,_std::allocator<example_*>_> *unaff_retaddr;
  size_t a;
  v_array<ACTION_SCORE::action_score> *in_stack_fffffffffffffff0;
  v_array<ACTION_SCORE::action_score> *this;
  
  (*(code *)PTR_delete_label_00479d28)(in_RDI);
  v_array<ACTION_SCORE::action_score>::delete_v(in_stack_fffffffffffffff0);
  if (((in_RDI->super_example_predict).feature_space[0].indicies.erase_count & 1) != 0) {
    for (this = (v_array<ACTION_SCORE::action_score> *)0x0;
        this < (v_array<ACTION_SCORE::action_score> *)
               (in_RDI->super_example_predict).feature_space[0].space_names.erase_count;
        this = (v_array<ACTION_SCORE::action_score> *)((long)&this->_begin + 1)) {
      std::vector<example_*,_std::allocator<example_*>_>::operator[]
                ((vector<example_*,_std::allocator<example_*>_> *)
                 &(in_RDI->super_example_predict).feature_space[0].space_names,(size_type)this);
      v_array<ACTION_SCORE::action_score>::delete_v(this);
      std::vector<example_*,_std::allocator<example_*>_>::operator[]
                ((vector<example_*,_std::allocator<example_*>_> *)
                 &(in_RDI->super_example_predict).feature_space[0].space_names,(size_type)this);
      VW::dealloc_example((_func_void_void_ptr *)unaff_retaddr,in_RDI,(_func_void_void_ptr *)this);
      std::vector<example_*,_std::allocator<example_*>_>::operator[]
                ((vector<example_*,_std::allocator<example_*>_> *)
                 &(in_RDI->super_example_predict).feature_space[0].space_names,(size_type)this);
      free_it((void *)0x286bc4);
    }
    std::vector<example_*,_std::allocator<example_*>_>::~vector(unaff_retaddr);
  }
  return;
}

Assistant:

void finish(cbify& data)
{
  CB::cb_label.delete_label(&data.cb_label);
  data.a_s.delete_v();
  if (data.use_adf)
  {
    for (size_t a = 0; a < data.adf_data.num_actions; ++a)
    {
      data.adf_data.ecs[a]->pred.a_s.delete_v();
      VW::dealloc_example(CB::cb_label.delete_label, *data.adf_data.ecs[a]);
      free_it(data.adf_data.ecs[a]);
    }
    data.adf_data.ecs.~vector<example*>();
  }
}